

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fp8.cpp
# Opt level: O2

float __thiscall MILBlob::Fp8E4M3FN::GetFloat(Fp8E4M3FN *this)

{
  FloatCast local_14;
  
  local_14.bytes = ((this->data).byte & 0xffffff80) << 0x18;
  if ((~(this->data).byte & 0x7f) == 0) {
    local_14.bytes = local_14.bytes | 0x7f800007;
  }
  else {
    HandleFp8ToFp32ExponentMantissa<MILBlob::Fp8E4M3FN,MILBlob::Fp8E4M3FN::Cast>
              (&this->data,&local_14);
    HandleFp8ToFp32Denormalize<MILBlob::Fp8E4M3FN::Cast_const>(&this->data,&local_14);
  }
  return local_14.f;
}

Assistant:

float Fp8E4M3FN::GetFloat() const
{
    FloatCast fp32 = {.f = 0};
    // Set the sign bit.
    fp32.components.sign = data.components.sign;
    // NaN case, infinity is not supported. We just use the mantissa from the fp8.
    if (data.components.exponent == (0x1 << fp8ExponentBits) - 1 && data.components.mantissa == 0x7) {
        fp32.components.exponent = 0xFF;
        fp32.components.mantissa = data.components.mantissa;
        return fp32.f;
    }
    HandleFp8ToFp32ExponentMantissa<Fp8E4M3FN, Fp8E4M3FN::Cast>(data, fp32);
    HandleFp8ToFp32Denormalize(data, fp32);
    return fp32.f;
}